

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS ref_gather_plt_brick_header(REF_GRID ref_grid,REF_CELL ref_cell,FILE *file)

{
  char cVar1;
  REF_MPI pRVar2;
  uint uVar3;
  size_t sVar4;
  undefined8 uVar5;
  ulong uVar6;
  char *pcVar7;
  size_t __n;
  int celldim;
  int aux;
  int numelements;
  int numpts;
  int faceneighbors;
  int varloc;
  int datapacking;
  int zonetype;
  int notused;
  int strandid;
  int parentzone;
  float zonemarker;
  REF_GLOB *l2c;
  REF_GLOB nnode;
  REF_LONG ncell;
  double solutiontime;
  char zonename [256];
  int ascii [256];
  undefined4 local_578;
  undefined4 local_574;
  undefined4 local_570;
  undefined4 local_56c;
  undefined4 local_568;
  undefined4 local_564;
  undefined4 local_560;
  undefined4 local_55c;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 local_550;
  undefined4 local_54c;
  REF_GLOB *local_548;
  ulong local_540;
  ulong local_538;
  char local_530;
  char cStack_52f;
  char cStack_52e;
  char cStack_52d;
  char cStack_52c;
  char cStack_52b;
  char cStack_52a;
  char acStack_529 [253];
  int aiStack_42c [259];
  
  pRVar2 = ref_grid->mpi;
  local_54c = 0x43958000;
  local_550 = 0xffffffff;
  local_554 = 0xffffffff;
  local_530 = '\0';
  cStack_52f = '\0';
  cStack_52e = '\0';
  cStack_52d = '\0';
  cStack_52c = '\0';
  cStack_52b = '\0';
  cStack_52a = '\0';
  acStack_529[0] = '\0';
  local_558 = 0xffffffff;
  local_560 = 0;
  local_564 = 0;
  local_568 = 0;
  local_578 = 0;
  local_574 = 0;
  local_55c = 5;
  uVar3 = ref_grid_compact_cell_nodes
                    (ref_grid,ref_cell,(REF_GLOB *)&local_540,(REF_LONG *)&local_538,&local_548);
  if (uVar3 != 0) {
    pcVar7 = "l2c";
    uVar5 = 0xeff;
    uVar6 = (ulong)uVar3;
LAB_00148a78:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar5,
           "ref_gather_plt_brick_header",uVar6,pcVar7);
    return uVar3;
  }
  if (0 < (long)local_538 && 0 < (long)local_540) {
    if (local_540 >> 0x1f == 0) {
      local_56c = (undefined4)local_540;
      if (local_538 < 0x80000000) {
        local_570 = (undefined4)local_538;
        if (pRVar2->id == 0) {
          __n = 1;
          sVar4 = fwrite(&local_54c,4,1,(FILE *)file);
          if (sVar4 != 1) {
            pcVar7 = "zonemarker";
            __n = 1;
            uVar5 = 0xf0b;
LAB_001490b8:
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,uVar5,"ref_gather_plt_brick_header",pcVar7,__n,sVar4);
            return 1;
          }
          snprintf((char *)((long)acStack_529 + 1),0x100,"brick%d",(ulong)(uint)ref_cell->node_per);
          do {
            cVar1 = acStack_529[__n];
            aiStack_42c[__n] = (int)cVar1;
            if (cVar1 == '\0') {
              sVar4 = fwrite(aiStack_42c + 1,4,__n,(FILE *)file);
              if (sVar4 != __n) {
                pcVar7 = "title";
                uVar5 = 0xf0f;
                goto LAB_001490b8;
              }
              sVar4 = fwrite(&local_550,4,1,(FILE *)file);
              if (sVar4 != 1) {
                pcVar7 = "int";
                __n = 1;
                uVar5 = 0xf11;
                goto LAB_001490b8;
              }
              sVar4 = fwrite(&local_554,4,1,(FILE *)file);
              if (sVar4 != 1) {
                pcVar7 = "int";
                __n = 1;
                uVar5 = 0xf12;
                goto LAB_001490b8;
              }
              sVar4 = fwrite(&stack0xfffffffffffffad0,8,1,(FILE *)file);
              if (sVar4 != 1) {
                pcVar7 = "double";
                __n = 1;
                uVar5 = 0xf13;
                goto LAB_001490b8;
              }
              sVar4 = fwrite(&local_558,4,1,(FILE *)file);
              if (sVar4 != 1) {
                pcVar7 = "int";
                __n = 1;
                uVar5 = 0xf14;
                goto LAB_001490b8;
              }
              sVar4 = fwrite(&local_55c,4,1,(FILE *)file);
              if (sVar4 != 1) {
                pcVar7 = "int";
                __n = 1;
                uVar5 = 0xf15;
                goto LAB_001490b8;
              }
              sVar4 = fwrite(&local_560,4,1,(FILE *)file);
              if (sVar4 != 1) {
                pcVar7 = "int";
                __n = 1;
                uVar5 = 0xf16;
                goto LAB_001490b8;
              }
              sVar4 = fwrite(&local_564,4,1,(FILE *)file);
              if (sVar4 != 1) {
                pcVar7 = "int";
                __n = 1;
                uVar5 = 0xf17;
                goto LAB_001490b8;
              }
              sVar4 = fwrite(&local_568,4,1,(FILE *)file);
              if (sVar4 != 1) {
                pcVar7 = "int";
                __n = 1;
                uVar5 = 0xf18;
                goto LAB_001490b8;
              }
              sVar4 = fwrite(&local_56c,4,1,(FILE *)file);
              if (sVar4 != 1) {
                pcVar7 = "int";
                __n = 1;
                uVar5 = 0xf19;
                goto LAB_001490b8;
              }
              sVar4 = fwrite(&local_570,4,1,(FILE *)file);
              if (sVar4 != 1) {
                pcVar7 = "int";
                __n = 1;
                uVar5 = 0xf1a;
                goto LAB_001490b8;
              }
              sVar4 = fwrite(&local_578,4,1,(FILE *)file);
              if (sVar4 != 1) {
                pcVar7 = "int";
                __n = 1;
                uVar5 = 0xf1b;
                goto LAB_001490b8;
              }
              sVar4 = fwrite(&local_578,4,1,(FILE *)file);
              if (sVar4 != 1) {
                pcVar7 = "int";
                __n = 1;
                uVar5 = 0xf1c;
                goto LAB_001490b8;
              }
              sVar4 = fwrite(&local_578,4,1,(FILE *)file);
              if (sVar4 == 1) {
                sVar4 = fwrite(&local_574,4,1,(FILE *)file);
                if (sVar4 == 1) goto LAB_00148aaf;
                pcVar7 = "int";
                __n = 1;
                uVar5 = 0xf1e;
              }
              else {
                pcVar7 = "int";
                __n = 1;
                uVar5 = 0xf1d;
              }
              goto LAB_001490b8;
            }
            __n = __n + 1;
          } while (__n != 0x101);
          pcVar7 = "a2i";
          uVar3 = 7;
          uVar5 = 0xf0e;
          uVar6 = 7;
          goto LAB_00148a78;
        }
        goto LAB_00148aaf;
      }
      pcVar7 = "too many bricks for int";
      uVar5 = 0xf07;
    }
    else {
      pcVar7 = "too many nodes for int";
      uVar5 = 0xf05;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar5,
           "ref_gather_plt_brick_header",pcVar7);
    return 1;
  }
LAB_00148aaf:
  if (local_548 != (REF_GLOB *)0x0) {
    free(local_548);
    return 0;
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_plt_brick_header(REF_GRID ref_grid,
                                                      REF_CELL ref_cell,
                                                      FILE *file) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  char zonename[256];
  int ascii[256];
  int len;
  float zonemarker = 299.0;
  int parentzone = -1;
  int strandid = -1;
  double solutiontime = 0.0;
  int notused = -1;
  int zonetype;
  int datapacking = 0; /*0=Block, point does not work.*/
  int varloc = 0;      /*0 = Don't specify, all data is located at nodes*/
  int faceneighbors = 0;
  int numpts;
  int numelements;
  REF_LONG ncell;
  REF_GLOB nnode, *l2c;
  int celldim = 0;
  int aux = 0;

  zonetype = 5; /*5=FEBRICK*/

  RSS(ref_grid_compact_cell_nodes(ref_grid, ref_cell, &nnode, &ncell, &l2c),
      "l2c");
  if (nnode <= 0 || ncell <= 0) {
    ref_free(l2c);
    return REF_SUCCESS;
  }

  RAS(nnode <= REF_INT_MAX, "too many nodes for int");
  numpts = (int)nnode;
  RAS(ncell <= REF_INT_MAX, "too many bricks for int");
  numelements = (int)ncell;

  if (ref_mpi_once(ref_mpi)) {
    REIS(1, fwrite(&zonemarker, sizeof(float), 1, file), "zonemarker");

    snprintf(zonename, 256, "brick%d", ref_cell_node_per(ref_cell));
    RSS(ref_gather_plt_char_int(zonename, 256, &len, ascii), "a2i");
    REIS(len, fwrite(&ascii, sizeof(int), (unsigned long)len, file), "title");

    REIS(1, fwrite(&parentzone, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&strandid, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&solutiontime, sizeof(double), 1, file), "double");
    REIS(1, fwrite(&notused, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&zonetype, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&datapacking, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&varloc, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&faceneighbors, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&numpts, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&numelements, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&celldim, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&celldim, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&celldim, sizeof(int), 1, file), "int");
    REIS(1, fwrite(&aux, sizeof(int), 1, file), "int");
  }

  ref_free(l2c);
  return REF_SUCCESS;
}